

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCase.cpp
# Opt level: O0

void __thiscall
vkt::Context::Context
          (Context *this,TestContext *testCtx,PlatformInterface *platformInterface,
          ProgramCollection<vk::ProgramBinary> *progCollection)

{
  PlatformInterface *vkPlatform;
  DefaultDevice *pDVar1;
  CommandLine *cmdLine;
  Allocator *pAVar2;
  DefaultDeleter<vk::Allocator> local_36;
  DefaultDeleter<vkt::DefaultDevice> local_35 [13];
  ProgramCollection<vk::ProgramBinary> *local_28;
  ProgramCollection<vk::ProgramBinary> *progCollection_local;
  PlatformInterface *platformInterface_local;
  TestContext *testCtx_local;
  Context *this_local;
  
  this->m_testCtx = testCtx;
  this->m_platformInterface = platformInterface;
  this->m_progCollection = progCollection;
  local_28 = progCollection;
  progCollection_local = (ProgramCollection<vk::ProgramBinary> *)platformInterface;
  platformInterface_local = (PlatformInterface *)testCtx;
  testCtx_local = (TestContext *)this;
  pDVar1 = (DefaultDevice *)operator_new(0xac0);
  vkPlatform = this->m_platformInterface;
  cmdLine = tcu::TestContext::getCommandLine((TestContext *)platformInterface_local);
  DefaultDevice::DefaultDevice(pDVar1,vkPlatform,cmdLine);
  de::DefaultDeleter<vkt::DefaultDevice>::DefaultDeleter(local_35);
  de::details::UniquePtr<vkt::DefaultDevice,_de::DefaultDeleter<vkt::DefaultDevice>_>::UniquePtr
            (&this->m_device,pDVar1);
  pDVar1 = de::details::UniqueBase<vkt::DefaultDevice,_de::DefaultDeleter<vkt::DefaultDevice>_>::get
                     (&(this->m_device).
                       super_UniqueBase<vkt::DefaultDevice,_de::DefaultDeleter<vkt::DefaultDevice>_>
                     );
  pAVar2 = createAllocator(pDVar1);
  de::DefaultDeleter<vk::Allocator>::DefaultDeleter(&local_36);
  de::details::UniquePtr<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>::UniquePtr
            (&this->m_allocator,pAVar2);
  return;
}

Assistant:

Context::Context (tcu::TestContext&							testCtx,
				  const vk::PlatformInterface&				platformInterface,
				  vk::ProgramCollection<vk::ProgramBinary>&	progCollection)
	: m_testCtx				(testCtx)
	, m_platformInterface	(platformInterface)
	, m_progCollection		(progCollection)
	, m_device				(new DefaultDevice(m_platformInterface, testCtx.getCommandLine()))
	, m_allocator			(createAllocator(m_device.get()))
{
}